

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O3

char __thiscall string_view::operator[](string_view *this,size_t pos)

{
  out_of_range *this_00;
  ulong uVar1;
  
  uVar1 = pos + this->_start;
  if (uVar1 < this->_end) {
    return (this->_str->_M_dataplus)._M_p[uVar1];
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"string_view index out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

char operator[](size_t pos) const {
        auto index = _start + pos;
        if (index >= _end) {
            throw std::out_of_range("string_view index out of range");
        }
        return _str[_start + pos];
    }